

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

uchar core::image::desaturate_luminance<unsigned_char>(uchar *v)

{
  return (uchar)(int)((float)v[2] * 0.11 + (float)*v * 0.3 + (float)v[1] * 0.59 + 0.5);
}

Assistant:

inline T
desaturate_luminance (T const* v)
{
    return math::interpolate(v[0], v[1], v[2], 0.30f, 0.59f, 0.11f);
}